

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderBuiltinConstantCase<tcu::Vector<int,_3>_>::iterate
          (ShaderBuiltinConstantCase<tcu::Vector<int,_3>_> *this)

{
  ostringstream *this_00;
  GetConstantValueFunc p_Var1;
  TestLog *pTVar2;
  bool bVar3;
  int iVar4;
  char *__s;
  ShaderExecutor *pSVar5;
  TestError *this_01;
  allocator<char> local_3b1;
  string *local_3b0;
  ulong local_3a8;
  ScopedLogSection section;
  void *outputs;
  UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  shaderExecutor;
  Vector<int,_3> local_374;
  Vector<int,_3> reference;
  Vector<int,_3> local_35c;
  Vector<int,_3> result;
  undefined1 local_330 [384];
  undefined1 local_1b0 [8];
  ostream local_1a8;
  
  p_Var1 = this->m_getValue;
  (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (*p_Var1)((Functions *)&reference);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  local_3a8 = 0;
  local_3b0 = &this->m_varName;
  this_00 = (ostringstream *)(local_330 + 8);
  while( true ) {
    if ((ShaderType)local_3a8 == SHADERTYPE_LAST) {
      return STOP;
    }
    __s = glu::getShaderTypeName((ShaderType)local_3a8);
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_330,__s,(allocator<char> *)&outputs);
    std::__cxx11::string::string<std::allocator<char>>((string *)&result,__s,&local_3b1);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)local_330,(string *)&result);
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)local_330);
    tcu::Vector<int,_3>::Vector(&local_374,&reference);
    pSVar5 = createGetConstantExecutor
                       (((this->super_TestCase).m_context)->m_renderCtx,(ShaderType)local_3a8,
                        TYPE_INT_VEC3,local_3b0,&this->m_requiredExt);
    shaderExecutor.
    super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
    .m_data.ptr = pSVar5;
    tcu::Vector<int,_3>::Vector(&result,-1);
    outputs = (string *)&result;
    iVar4 = (*pSVar5->_vptr_ShaderExecutor[2])(pSVar5);
    if ((char)iVar4 == '\0') break;
    (*(shaderExecutor.
       super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
       .m_data.ptr)->_vptr_ShaderExecutor[5])();
    (*(shaderExecutor.
       super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
       .m_data.ptr)->_vptr_ShaderExecutor[6])
              (shaderExecutor.
               super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
               .m_data.ptr,1,0,&outputs);
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    tcu::Vector<int,_3>::Vector(&local_35c,&result);
    local_1b0 = (undefined1  [8])pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<(&local_1a8,(string *)local_3b0);
    std::operator<<(&local_1a8," = ");
    tcu::operator<<(&local_1a8,&local_35c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    bVar3 = tcu::Vector<int,_3>::operator!=(&result,&local_374);
    if (bVar3) {
      local_330._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"ERROR: Expected ");
      std::operator<<((ostream *)this_00,(string *)local_3b0);
      std::operator<<((ostream *)this_00," = ");
      tcu::operator<<((ostream *)this_00,&local_374);
      local_1b0 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_330,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"Test shader:");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      (*(shaderExecutor.
         super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
         .m_data.ptr)->_vptr_ShaderExecutor[3])
                (shaderExecutor.
                 super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                 .m_data.ptr,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
                );
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Invalid builtin constant value");
    }
    de::details::
    UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
    ::~UniqueBase(&shaderExecutor.
                   super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                 );
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    local_3a8 = (ulong)((int)local_3a8 + 1);
  }
  (*(shaderExecutor.
     super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
     .m_data.ptr)->_vptr_ShaderExecutor[3])
            (shaderExecutor.
             super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
             .m_data.ptr,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
             ,0xe8);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestCase::IterateResult ShaderBuiltinConstantCase<DataType>::iterate (void)
{
	const DataType	reference	= m_getValue(m_context.getRenderContext().getFunctions());

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	for (int shaderType = 0; shaderType < glu::SHADERTYPE_LAST; shaderType++)
	{
		if ((SHADER_TYPES & (1<<shaderType)) != 0)
		{
			const char* const			shaderTypeName	= glu::getShaderTypeName(glu::ShaderType(shaderType));
			const tcu::ScopedLogSection	section			(m_testCtx.getLog(), shaderTypeName, shaderTypeName);

			try
			{
				const bool isOk = verifyInShaderType(glu::ShaderType(shaderType), reference);
				DE_ASSERT(isOk || m_testCtx.getTestResult() != QP_TEST_RESULT_PASS);
				DE_UNREF(isOk);
			}
			catch (const tcu::NotSupportedError& e)
			{
				m_testCtx.getLog() << TestLog::Message << "Not checking " << shaderTypeName << ": " << e.what() << TestLog::EndMessage;
			}
			catch (const tcu::TestError& e)
			{
				m_testCtx.getLog() << TestLog::Message << e.what() << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, e.getMessage());
			}
		}
	}

	return STOP;
}